

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

mt32emu_return_code
mt32emu_add_rom_data
          (mt32emu_context context,mt32emu_bit8u *data,size_t data_size,
          mt32emu_sha1_digest *sha1_digest)

{
  ArrayFile *pAVar1;
  mt32emu_sha1_digest *sha1_digest_local;
  size_t data_size_local;
  mt32emu_bit8u *data_local;
  mt32emu_context context_local;
  
  if (sha1_digest == (mt32emu_sha1_digest *)0x0) {
    pAVar1 = (ArrayFile *)operator_new(0x50);
    MT32Emu::ArrayFile::ArrayFile(pAVar1,data,data_size);
    context_local._4_4_ =
         MT32Emu::addROMFiles(context,(File *)pAVar1,(File *)0x0,(MachineConfiguration *)0x0);
  }
  else {
    pAVar1 = (ArrayFile *)operator_new(0x50);
    MT32Emu::ArrayFile::ArrayFile(pAVar1,data,data_size,sha1_digest);
    context_local._4_4_ =
         MT32Emu::addROMFiles(context,(File *)pAVar1,(File *)0x0,(MachineConfiguration *)0x0);
  }
  return context_local._4_4_;
}

Assistant:

mt32emu_return_code MT32EMU_C_CALL mt32emu_add_rom_data(mt32emu_context context, const mt32emu_bit8u *data, size_t data_size, const mt32emu_sha1_digest *sha1_digest) {
	if (sha1_digest == NULL) return addROMFiles(context, new ArrayFile(data, data_size));
	return addROMFiles(context, new ArrayFile(data, data_size, *sha1_digest));
}